

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateFileAndDeps
          (Generator *this,GeneratorOptions *options,Printer *printer,FileDescriptor *root,
          set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *all_files,
          set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *generated)

{
  FileDescriptor *root_00;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  int index;
  _Rb_tree_header *p_Var3;
  FileDescriptor *local_38;
  
  p_Var1 = (generated->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var1 != (_Base_ptr)0x0) {
    p_Var3 = &(generated->_M_t)._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var3->_M_header;
    do {
      if (*(FileDescriptor **)(p_Var1 + 1) >= root) {
        p_Var2 = p_Var1;
      }
      p_Var1 = (&p_Var1->_M_left)[*(FileDescriptor **)(p_Var1 + 1) < root];
    } while (p_Var1 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var3) && (*(FileDescriptor **)(p_Var2 + 1) <= root)) {
      return;
    }
  }
  local_38 = root;
  std::
  _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
  ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
            ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
              *)generated,&local_38);
  if (0 < *(int *)(local_38 + 0x18)) {
    index = 0;
    do {
      root_00 = FileDescriptor::dependency(local_38,index);
      GenerateFileAndDeps(this,options,printer,root_00,all_files,generated);
      index = index + 1;
    } while (index < *(int *)(local_38 + 0x18));
  }
  p_Var1 = (all_files->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var1 != (_Base_ptr)0x0) {
    p_Var3 = &(all_files->_M_t)._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var3->_M_header;
    do {
      if (*(FileDescriptor **)(p_Var1 + 1) >= local_38) {
        p_Var2 = p_Var1;
      }
      p_Var1 = (&p_Var1->_M_left)[*(FileDescriptor **)(p_Var1 + 1) < local_38];
    } while (p_Var1 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var3) && (*(FileDescriptor **)(p_Var2 + 1) <= local_38)) {
      GenerateClassesAndEnums(this,options,printer,local_38);
    }
  }
  return;
}

Assistant:

void Generator::GenerateFileAndDeps(
    const GeneratorOptions& options,
    io::Printer* printer,
    const FileDescriptor* root,
    std::set<const FileDescriptor*>* all_files,
    std::set<const FileDescriptor*>* generated) const {
  // Skip if already generated.
  if (generated->find(root) != generated->end()) {
    return;
  }
  generated->insert(root);

  // Generate all dependencies before this file's content.
  for (int i = 0; i < root->dependency_count(); i++) {
    const FileDescriptor* dep = root->dependency(i);
    GenerateFileAndDeps(options, printer, dep, all_files, generated);
  }

  // Generate this file's content.  Only generate if the file is part of the
  // original set requested to be generated; i.e., don't take all transitive
  // deps down to the roots.
  if (all_files->find(root) != all_files->end()) {
    GenerateClassesAndEnums(options, printer, root);
  }
}